

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O1

const_iterator __thiscall GainBuckets::addCell(GainBuckets *this,int gain,uint cell)

{
  size_t *psVar1;
  Bucket *pBVar2;
  _List_node_base *p_Var3;
  _Node_alloc_type *__alloc;
  
  this->num_elems_ = this->num_elems_ + 1;
  if (this->best_gain_ < gain) {
    this->best_gain_ = gain;
  }
  pBVar2 = operator[][abi_cxx11_(this,gain);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(uint *)&p_Var3[1]._M_next = cell;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(pBVar2->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  pBVar2 = operator[][abi_cxx11_(this,gain);
  return (const_iterator)
         (pBVar2->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
         super__List_node_base._M_next;
}

Assistant:

GainBuckets::Bucket::const_iterator GainBuckets::addCell(int gain, unsigned cell) {
  ++num_elems_;
  if (gain > best_gain_)
    best_gain_ = gain;
  (*this)[gain].push_front(cell);
  return (*this)[gain].cbegin();
}